

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_tile.c
# Opt level: O3

uint64_t TIFFVTileSize64(TIFF *tif,uint32_t nrows)

{
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint uVar4;
  ulong first;
  uint uVar5;
  ulong second;
  uint16_t ycbcrsubsampling [2];
  ushort local_2c;
  ushort local_2a;
  
  if ((((tif->tif_dir).td_tilelength == 0) || ((tif->tif_dir).td_tilewidth == 0)) ||
     ((tif->tif_dir).td_tiledepth == 0)) {
    uVar2 = 0;
  }
  else {
    if ((((tif->tif_dir).td_planarconfig != 1) || ((tif->tif_dir).td_photometric != 6)) ||
       (((tif->tif_dir).td_samplesperpixel != 3 || ((tif->tif_flags & 0x4000) != 0)))) {
      uVar2 = TIFFTileRowSize64(tif);
      uVar2 = _TIFFMultiply64(tif,(ulong)nrows,uVar2,"TIFFVTileSize64");
      return uVar2;
    }
    TIFFGetFieldDefaulted(tif,0x212,&local_2c,&local_2a);
    if (((local_2c < 5) && ((0x16U >> (local_2c & 0x1f) & 1) != 0)) &&
       ((uVar5 = (uint)local_2a, uVar5 < 5 && ((0x16U >> (uVar5 & 0x1f) & 1) != 0)))) {
      uVar4 = (uint)local_2c;
      uVar1 = (tif->tif_dir).td_tilewidth;
      if (uVar1 < -uVar4) {
        first = (ulong)((uVar1 + uVar4) - 1) / (ulong)uVar4;
      }
      else {
        first = 0;
      }
      if (nrows < -uVar5) {
        second = (ulong)((nrows + uVar5) - 1) / (ulong)uVar5;
      }
      else {
        second = 0;
      }
      uVar2 = _TIFFMultiply64(tif,first,(ulong)(uVar5 * uVar4 + 2 & 0xffff),"TIFFVTileSize64");
      uVar3 = _TIFFMultiply64(tif,uVar2,(ulong)(tif->tif_dir).td_bitspersample,"TIFFVTileSize64");
      uVar2 = _TIFFMultiply64(tif,uVar2,(ulong)(tif->tif_dir).td_bitspersample,"TIFFVTileSize64");
      uVar2 = _TIFFMultiply64(tif,((uVar2 >> 3) + 1) - (ulong)((uVar3 & 7) == 0),second,
                              "TIFFVTileSize64");
    }
    else {
      uVar2 = 0;
      TIFFErrorExtR(tif,"TIFFVTileSize64","Invalid YCbCr subsampling (%dx%d)",(ulong)local_2c,
                    (ulong)local_2a);
    }
  }
  return uVar2;
}

Assistant:

uint64_t TIFFVTileSize64(TIFF *tif, uint32_t nrows)
{
    static const char module[] = "TIFFVTileSize64";
    TIFFDirectory *td = &tif->tif_dir;
    if (td->td_tilelength == 0 || td->td_tilewidth == 0 ||
        td->td_tiledepth == 0)
        return (0);
    if ((td->td_planarconfig == PLANARCONFIG_CONTIG) &&
        (td->td_photometric == PHOTOMETRIC_YCBCR) &&
        (td->td_samplesperpixel == 3) && (!isUpSampled(tif)))
    {
        /*
         * Packed YCbCr data contain one Cb+Cr for every
         * HorizontalSampling*VerticalSampling Y values.
         * Must also roundup width and height when calculating
         * since images that are not a multiple of the
         * horizontal/vertical subsampling area include
         * YCbCr data for the extended image.
         */
        uint16_t ycbcrsubsampling[2];
        uint16_t samplingblock_samples;
        uint32_t samplingblocks_hor;
        uint32_t samplingblocks_ver;
        uint64_t samplingrow_samples;
        uint64_t samplingrow_size;
        TIFFGetFieldDefaulted(tif, TIFFTAG_YCBCRSUBSAMPLING,
                              ycbcrsubsampling + 0, ycbcrsubsampling + 1);
        if ((ycbcrsubsampling[0] != 1 && ycbcrsubsampling[0] != 2 &&
             ycbcrsubsampling[0] != 4) ||
            (ycbcrsubsampling[1] != 1 && ycbcrsubsampling[1] != 2 &&
             ycbcrsubsampling[1] != 4))
        {
            TIFFErrorExtR(tif, module, "Invalid YCbCr subsampling (%dx%d)",
                          ycbcrsubsampling[0], ycbcrsubsampling[1]);
            return 0;
        }
        samplingblock_samples = ycbcrsubsampling[0] * ycbcrsubsampling[1] + 2;
        samplingblocks_hor =
            TIFFhowmany_32(td->td_tilewidth, ycbcrsubsampling[0]);
        samplingblocks_ver = TIFFhowmany_32(nrows, ycbcrsubsampling[1]);
        samplingrow_samples = _TIFFMultiply64(tif, samplingblocks_hor,
                                              samplingblock_samples, module);
        samplingrow_size = TIFFhowmany8_64(_TIFFMultiply64(
            tif, samplingrow_samples, td->td_bitspersample, module));
        return (
            _TIFFMultiply64(tif, samplingrow_size, samplingblocks_ver, module));
    }
    else
        return (_TIFFMultiply64(tif, nrows, TIFFTileRowSize64(tif), module));
}